

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O3

void __thiscall pbrt::semantic::PBRTInfo::traverse(PBRTInfo *this,SP *object)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  _func_int **pp_Var9;
  _Base_ptr p_Var10;
  element_type *peVar11;
  ostream *poVar12;
  _Base_ptr p_Var13;
  long lVar14;
  iterator __end2;
  _Base_ptr p_Var15;
  pointer psVar16;
  pointer psVar17;
  iterator __begin2;
  pointer psVar18;
  Entity local_70;
  SP *local_50;
  SP local_48;
  _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
  *local_38;
  
  p_Var13 = (this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header;
  p_Var15 = &p_Var2->_M_header;
  if (p_Var13 != (_Base_ptr)0x0) {
    peVar11 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var10 = &p_Var2->_M_header;
    do {
      if (*(element_type **)(p_Var13 + 1) >= peVar11) {
        p_Var10 = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[*(element_type **)(p_Var13 + 1) < peVar11];
    } while (p_Var13 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
       (p_Var15 = p_Var10, peVar11 < *(element_type **)(p_Var10 + 1))) {
      p_Var15 = &p_Var2->_M_header;
    }
  }
  std::
  _Rb_tree<std::shared_ptr<pbrt::Object>,std::shared_ptr<pbrt::Object>,std::_Identity<std::shared_ptr<pbrt::Object>>,std::less<std::shared_ptr<pbrt::Object>>,std::allocator<std::shared_ptr<pbrt::Object>>>
  ::_M_insert_unique<std::shared_ptr<pbrt::Object>const&>
            ((_Rb_tree<std::shared_ptr<pbrt::Object>,std::shared_ptr<pbrt::Object>,std::_Identity<std::shared_ptr<pbrt::Object>>,std::less<std::shared_ptr<pbrt::Object>>,std::allocator<std::shared_ptr<pbrt::Object>>>
              *)&this->alreadyTraversed,object);
  psVar1 = &(this->numObjects).instanced;
  *psVar1 = *psVar1 + 1;
  if ((_Rb_tree_header *)p_Var15 == p_Var2) {
    (this->numObjects).unique = (this->numObjects).unique + 1;
  }
  peVar11 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar18 = (peVar11->lightSources).
            super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (peVar11->lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)psVar3 - (long)psVar18 >> 4;
  psVar1 = &(this->numLights).instanced;
  *psVar1 = *psVar1 + lVar14;
  if ((_Rb_tree_header *)p_Var15 == p_Var2) {
    (this->numLights).unique = (this->numLights).unique + lVar14;
  }
  local_50 = object;
  if (psVar18 != psVar3) {
    do {
      p_Var4 = (psVar18->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      Entity::as<pbrt::PointLightSource>(&local_70);
      pp_Var9 = local_70._vptr_Entity;
      if (local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var9 != (_func_int **)0x0) &&
         (psVar1 = &(this->numPointLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var15 == p_Var2)) {
        (this->numPointLights).unique = (this->numPointLights).unique + 1;
      }
      Entity::as<pbrt::SpotLightSource>(&local_70);
      pp_Var9 = local_70._vptr_Entity;
      if (local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var9 != (_func_int **)0x0) &&
         (psVar1 = &(this->numSpotLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var15 == p_Var2)) {
        (this->numSpotLights).unique = (this->numSpotLights).unique + 1;
      }
      Entity::as<pbrt::InfiniteLightSource>(&local_70);
      pp_Var9 = local_70._vptr_Entity;
      if (local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var9 != (_func_int **)0x0) &&
         (psVar1 = &(this->numInfiniteLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var15 == p_Var2)) {
        (this->numInfiniteLights).unique = (this->numInfiniteLights).unique + 1;
      }
      Entity::as<pbrt::DistantLightSource>(&local_70);
      pp_Var9 = local_70._vptr_Entity;
      if (local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
          super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                   super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((pp_Var9 != (_func_int **)0x0) &&
         (psVar1 = &(this->numDistantLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var15 == p_Var2)) {
        (this->numDistantLights).unique = (this->numDistantLights).unique + 1;
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      psVar18 = psVar18 + 1;
    } while (psVar18 != psVar3);
    peVar11 = (local_50->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  psVar16 = (peVar11->shapes).
            super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (peVar11->shapes).
           super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)psVar5 - (long)psVar16 >> 4;
  psVar1 = &(this->numShapes).instanced;
  *psVar1 = *psVar1 + lVar14;
  if ((_Rb_tree_header *)p_Var15 == p_Var2) {
    (this->numShapes).unique = (this->numShapes).unique + lVar14;
  }
  if (psVar16 != psVar5) {
    local_38 = (_Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
                *)&this->usedMaterials;
    do {
      peVar6 = (psVar16->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var4 = (psVar16->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
      ::_M_insert_unique<std::shared_ptr<pbrt::Material>const&>(local_38,&peVar6->material);
      if (((peVar6->areaLight).super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (psVar1 = &(this->numAreaLights).instanced, *psVar1 = *psVar1 + 1,
         (_Rb_tree_header *)p_Var15 == p_Var2)) {
        (this->numAreaLights).unique = (this->numAreaLights).unique + 1;
      }
      lVar14 = __dynamic_cast(peVar6,&Shape::typeinfo,&TriangleMesh::typeinfo,0);
      if (lVar14 == 0) {
        lVar14 = __dynamic_cast(peVar6,&Shape::typeinfo,&QuadMesh::typeinfo,0);
        if (lVar14 != 0) {
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          lVar14 = *(long *)(lVar14 + 0xa8) - *(long *)(lVar14 + 0xa0) >> 4;
          psVar1 = &(this->numQuads).instanced;
          *psVar1 = *psVar1 + lVar14;
          if ((_Rb_tree_header *)p_Var15 == p_Var2) {
            (this->numQuads).unique = (this->numQuads).unique + lVar14;
          }
          goto LAB_0010e2cb;
        }
        lVar14 = __dynamic_cast(peVar6,&Shape::typeinfo,&Sphere::typeinfo,0);
        if (lVar14 != 0) {
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          psVar1 = &(this->numSpheres).instanced;
          *psVar1 = *psVar1 + 1;
          if ((_Rb_tree_header *)p_Var15 == p_Var2) {
            (this->numSpheres).unique = (this->numSpheres).unique + 1;
          }
          goto LAB_0010e2cb;
        }
        lVar14 = __dynamic_cast(peVar6,&Shape::typeinfo,&Disk::typeinfo,0);
        if (lVar14 != 0) {
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          psVar1 = &(this->numDisks).instanced;
          *psVar1 = *psVar1 + 1;
          if ((_Rb_tree_header *)p_Var15 == p_Var2) {
            (this->numDisks).unique = (this->numDisks).unique + 1;
          }
          goto LAB_0010e2cb;
        }
        lVar14 = __dynamic_cast(peVar6,&Shape::typeinfo,&Curve::typeinfo,0);
        if (lVar14 != 0) {
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          psVar1 = &(this->numCurves).instanced;
          *psVar1 = *psVar1 + 1;
          if ((_Rb_tree_header *)p_Var15 == p_Var2) {
            (this->numCurves).unique = (this->numCurves).unique + 1;
          }
          goto LAB_0010e2cb;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"un-handled geometry type : ",0x1b);
        (**(peVar6->super_Entity)._vptr_Entity)(&local_70,peVar6);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_70._vptr_Entity,
                             (long)local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this
                                   .super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        if ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)local_70._vptr_Entity !=
            &local_70.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
             super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete(local_70._vptr_Entity);
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010e2d8;
      }
      else {
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        lVar14 = (*(long *)(lVar14 + 0xc0) - *(long *)(lVar14 + 0xb8) >> 2) * -0x5555555555555555;
        psVar1 = &(this->numTriangles).instanced;
        *psVar1 = *psVar1 + lVar14;
        if ((_Rb_tree_header *)p_Var15 == p_Var2) {
          (this->numTriangles).unique = (this->numTriangles).unique + lVar14;
        }
LAB_0010e2cb:
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
LAB_0010e2d8:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 != psVar5);
    peVar11 = (local_50->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  psVar17 = (peVar11->instances).
            super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar7 = (peVar11->instances).
           super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar14 = (long)psVar7 - (long)psVar17 >> 4;
  psVar1 = &(this->numInstances).instanced;
  *psVar1 = *psVar1 + lVar14;
  if ((_Rb_tree_header *)p_Var15 == p_Var2) {
    (this->numInstances).unique = (this->numInstances).unique + lVar14;
  }
  if (psVar17 != psVar7) {
    do {
      peVar8 = (psVar17->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var4 = (psVar17->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar8->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (peVar8->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      if (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      traverse(this,&local_48);
      if (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      psVar17 = psVar17 + 1;
    } while (psVar17 != psVar7);
  }
  return;
}

Assistant:

void traverse(Object::SP object)
      {
        const bool firstTime = (alreadyTraversed.find(object) == alreadyTraversed.end());
        alreadyTraversed.insert(object);
 
        numObjects.add(firstTime,1);
        numLights.add(firstTime,object->lightSources.size());

        for (auto light : object->lightSources) {
          if (light->as<PointLightSource>())
            numPointLights.add(firstTime,1);
          if (light->as<SpotLightSource>())
            numSpotLights.add(firstTime,1);
          if (light->as<InfiniteLightSource>())
            numInfiniteLights.add(firstTime,1);
          if (light->as<DistantLightSource>())
            numDistantLights.add(firstTime,1);
        }
        
        numShapes.add(firstTime,object->shapes.size());
        
        for (auto shape : object->shapes) {
          usedMaterials.insert(shape->material);
          if (shape->areaLight) {
            numAreaLights.add(firstTime,1);
          }
          if (TriangleMesh::SP mesh=std::dynamic_pointer_cast<TriangleMesh>(shape)){
            numTriangles.add(firstTime,mesh->index.size());
          } else if (QuadMesh::SP mesh=std::dynamic_pointer_cast<QuadMesh>(shape)){
            numQuads.add(firstTime,mesh->index.size());
          } else if (Sphere::SP sphere=std::dynamic_pointer_cast<Sphere>(shape)){
            numSpheres.add(firstTime,1);
          } else if (Disk::SP disk=std::dynamic_pointer_cast<Disk>(shape)){
            numDisks.add(firstTime,1);
          } else if (Curve::SP curves=std::dynamic_pointer_cast<Curve>(shape)){
            numCurves.add(firstTime,1);
          } else
            std::cout << "un-handled geometry type : " << shape->toString() << std::endl;
        }

        numInstances.add(firstTime,object->instances.size());
        for (auto inst : object->instances) {
          traverse(inst->object);
        }
      }